

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void auto_commit_space_used_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_iterator **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle **ptr_handle;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  long lVar9;
  fdb_doc **ppfVar10;
  fdb_doc *pfVar11;
  char *ptr_handle_00;
  fdb_config *pfVar12;
  fdb_doc *__s;
  char *pcVar13;
  fdb_iterator **doc_00;
  fdb_file_handle **ptr_fhandle;
  uint uVar14;
  ulong uVar15;
  fdb_doc **doc_01;
  fdb_iterator **ptr_iterator;
  fdb_kvs_handle **ptr_handle_01;
  char *handle;
  bool bVar16;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char fname [32];
  timeval __test_begin;
  fdb_file_info finfo;
  fdb_kvs_handle *pfStack_1b768;
  fdb_file_handle *pfStack_1b760;
  void *pvStack_1b758;
  size_t asStack_1b750 [3];
  undefined4 uStack_1b738;
  undefined4 uStack_1b734;
  undefined4 uStack_1b730;
  undefined4 uStack_1b72c;
  undefined4 uStack_1b728;
  fdb_kvs_config fStack_1b720;
  timeval tStack_1b708;
  fdb_config fStack_1b6f8;
  char acStack_1b600 [256];
  char acStack_1b500 [256];
  char acStack_1b400 [264];
  fdb_config *pfStack_1b2f8;
  fdb_iterator **ppfStack_1b2f0;
  fdb_kvs_handle *pfStack_1b2e8;
  fdb_iterator **ppfStack_1b2e0;
  fdb_kvs_handle *pfStack_1b2d8;
  code *pcStack_1b2d0;
  fdb_iterator *pfStack_1b2b8;
  fdb_file_handle *pfStack_1b2b0;
  fdb_kvs_handle *pfStack_1b2a8;
  fdb_kvs_handle *pfStack_1b2a0;
  fdb_kvs_config fStack_1b298;
  timeval tStack_1b280;
  fdb_config fStack_1b270;
  fdb_iterator *apfStack_1b178 [32];
  fdb_config fStack_1b078;
  fdb_kvs_handle **ppfStack_1af70;
  fdb_iterator **ppfStack_1af68;
  fdb_iterator **ppfStack_1af60;
  fdb_kvs_handle *pfStack_1af58;
  fdb_iterator *pfStack_1af48;
  fdb_kvs_handle *pfStack_1af40;
  fdb_iterator **ppfStack_1af38;
  fdb_kvs_handle *pfStack_1af30;
  fdb_kvs_config fStack_1af28;
  fdb_kvs_handle *apfStack_1af10 [8];
  undefined1 auStack_1aed0 [64];
  fdb_iterator *apfStack_1ae90 [33];
  fdb_config fStack_1ad88;
  fdb_iterator *apfStack_1ac90 [32];
  fdb_iterator *apfStack_1ab90 [32];
  fdb_kvs_handle fStack_1aa90;
  undefined8 auStack_1a690 [896];
  fdb_kvs_handle *apfStack_18a90 [1025];
  fdb_doc **ppfStack_16a88;
  char *pcStack_16a80;
  long lStack_16a78;
  fdb_doc *pfStack_16a70;
  fdb_doc **ppfStack_16a68;
  fdb_doc *pfStack_16a60;
  fdb_doc *pfStack_16a48;
  fdb_file_handle *pfStack_16a40;
  long lStack_16a38;
  fdb_kvs_handle *pfStack_16a30;
  long lStack_16a28;
  long lStack_16a20;
  fdb_doc **ppfStack_16a18;
  long lStack_16a10;
  fdb_doc **ppfStack_16a08;
  size_t sStack_16a00;
  timeval tStack_169f8;
  fdb_kvs_config fStack_169e8;
  fdb_file_info fStack_169d0;
  fdb_doc afStack_16988 [3];
  char acStack_16888 [264];
  fdb_config fStack_16780;
  char acStack_16688 [256];
  fdb_doc *apfStack_16588 [2999];
  size_t sStack_107d0;
  size_t asStack_107c8 [1023];
  undefined1 auStack_e7c9 [57225];
  fdb_doc **ppfStack_840;
  fdb_config *pfStack_838;
  fdb_file_handle **ppfStack_830;
  ulong uStack_828;
  fdb_kvs_handle **ppfStack_820;
  fdb_kvs_handle **ppfStack_818;
  fdb_doc *pfStack_800;
  fdb_kvs_handle *pfStack_7f8;
  undefined1 auStack_7f0 [24];
  fdb_file_handle *pfStack_7d8;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_config fStack_7c8;
  fdb_doc *apfStack_7b0 [31];
  timeval tStack_6b8;
  fdb_config fStack_6a8;
  char acStack_5b0 [256];
  fdb_file_handle *apfStack_4b0 [32];
  char acStack_3b0 [264];
  fdb_kvs_handle **ppfStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  ulong uStack_290;
  undefined8 uStack_288;
  code *pcStack_280;
  fdb_file_handle *local_278;
  fdb_kvs_handle *local_270;
  char local_268 [32];
  fdb_kvs_config local_248;
  timeval local_230;
  fdb_file_info local_220 [3];
  fdb_config local_128;
  
  pcStack_280 = (code *)0x1183fc;
  gettimeofday(&local_230,(__timezone_ptr_t)0x0);
  pcStack_280 = (code *)0x118401;
  memleak_start();
  pcStack_280 = (code *)0x11840d;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_280 = (code *)0x11841d;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.auto_commit = true;
  pcStack_280 = (code *)0x118436;
  fdb_get_default_config();
  pcStack_280 = (code *)0x118446;
  memcpy(&local_128,local_220,0xf8);
  pcStack_280 = (code *)0x118450;
  fdb_get_default_kvs_config();
  uVar15 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(local_268 + 8,"est1",5);
    builtin_strncpy(local_268,"./func_t",8);
    pcStack_280 = (code *)0x11849b;
    fVar3 = fdb_open(&local_278,local_268,&local_128);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_280 = (code *)0x1184b7;
    fVar3 = fdb_kvs_open(local_278,&local_270,"justonekv",&local_248);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_280 = (code *)0x118570;
      auto_commit_space_used_test();
      break;
    }
    pcStack_280 = (code *)0x1184cd;
    fVar3 = fdb_get_file_info(local_278,local_220);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011857a;
    if (local_220[0].file_size != local_128.blocksize * 7) {
      pcStack_280 = (code *)0x11851c;
      auto_commit_space_used_test();
    }
    pcStack_280 = (code *)0x1184f8;
    fVar3 = fdb_close(local_278);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118575;
    uVar14 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_280 = (code *)0x118523;
      fdb_shutdown();
      pcStack_280 = (code *)0x118528;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_280 = (code *)0x118559;
      fprintf(_stderr,pcVar13,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_280 = (code *)0x118575;
  auto_commit_space_used_test();
LAB_00118575:
  pcStack_280 = (code *)0x11857a;
  auto_commit_space_used_test();
LAB_0011857a:
  pcStack_280 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_288 = 0x745f636e75662f2e;
  pcStack_298 = "justonekv";
  ppfStack_818 = (fdb_kvs_handle **)0x1185a2;
  ppfStack_2a8 = &local_270;
  pcStack_2a0 = local_268;
  uStack_290 = uVar15;
  pcStack_280 = (code *)&local_278;
  gettimeofday(&tStack_6b8,(__timezone_ptr_t)0x0);
  ppfStack_818 = (fdb_kvs_handle **)0x1185a7;
  memleak_start();
  pfStack_800 = (fdb_doc *)0x0;
  ppfStack_818 = (fdb_kvs_handle **)0x1185b8;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_818 = (fdb_kvs_handle **)0x1185c8;
  fdb_get_default_config();
  ppfStack_818 = (fdb_kvs_handle **)0x1185d5;
  fdb_get_default_kvs_config();
  fStack_6a8.buffercache_size = 0;
  fStack_6a8.flags = 1;
  fStack_6a8.purging_interval = 0;
  fStack_6a8.compaction_threshold = '\0';
  ppfStack_818 = (fdb_kvs_handle **)0x118608;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x11861b;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x11862c;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x11863d;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  ppfVar10 = apfStack_7b0;
  uVar15 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118661;
    sprintf(acStack_5b0,"key%d",uVar15 & 0xffffffff);
    ppfStack_818 = (fdb_kvs_handle **)0x11867d;
    sprintf(acStack_3b0,"meta%d",uVar15 & 0xffffffff);
    ptr_fhandle = apfStack_4b0;
    ppfStack_818 = (fdb_kvs_handle **)0x118699;
    sprintf((char *)ptr_fhandle,"body%d",uVar15 & 0xffffffff);
    ppfStack_818 = (fdb_kvs_handle **)0x1186a1;
    ptr_handle = (fdb_kvs_handle **)strlen(acStack_5b0);
    ppfStack_818 = (fdb_kvs_handle **)0x1186ac;
    sVar5 = strlen(acStack_3b0);
    ppfStack_818 = (fdb_kvs_handle **)0x1186b7;
    sVar6 = strlen((char *)ptr_fhandle);
    ppfStack_818 = (fdb_kvs_handle **)0x1186d7;
    fdb_doc_create(ppfVar10,acStack_5b0,(size_t)ptr_handle,acStack_3b0,sVar5,ptr_fhandle,sVar6);
    uVar15 = uVar15 + 1;
    ppfVar10 = ppfVar10 + 1;
  } while (uVar15 != 0x1e);
  ppfStack_818 = (fdb_kvs_handle **)0x1186f7;
  fdb_set(pfStack_7f8,apfStack_7b0[0]);
  ppfStack_818 = (fdb_kvs_handle **)0x118706;
  fdb_set(pfStack_7f8,apfStack_7b0[1]);
  ppfStack_818 = (fdb_kvs_handle **)0x118715;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118726;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar9 + 2]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x118741;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118749;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118756;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar12 = &fStack_6a8;
  ppfStack_818 = (fdb_kvs_handle **)0x118773;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",pfVar12);
  ppfStack_818 = (fdb_kvs_handle **)0x118781;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",pfVar12);
  ppfStack_818 = (fdb_kvs_handle **)0x118796;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1187a6;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  uVar15 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1187d2;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar15]->key,apfStack_7b0[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x1187e1;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if (uVar15 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d89;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d8e;
    ppfStack_818 = (fdb_kvs_handle **)0x118802;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 4);
  ppfStack_818 = (fdb_kvs_handle **)0x118823;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118834;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar9 + 2]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118851;
    fdb_set(pfStack_7f8,apfStack_7b0[lVar9 + 4]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x11886c;
  fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118879;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118881;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ptr_handle_01 = (fdb_kvs_handle **)0x1541a5;
  pfVar12 = &fStack_6a8;
  ppfStack_818 = (fdb_kvs_handle **)0x11889e;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",pfVar12);
  ppfStack_818 = (fdb_kvs_handle **)0x1188ac;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",pfVar12);
  ppfStack_818 = (fdb_kvs_handle **)0x1188c1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1188d1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  uVar15 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1188fd;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar15]->key,apfStack_7b0[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x11890c;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if ((uVar15 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_818 = (fdb_kvs_handle **)0x118d84;
      last_wal_flush_header_test();
      goto LAB_00118d84;
    }
    ppfStack_818 = (fdb_kvs_handle **)0x118924;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 6);
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x11894a;
    fdb_set(pfStack_7f8,apfStack_7b0[lVar9 + 4]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x118962;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118976;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar9 + 6]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x11898e;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x1189aa;
  fdb_open(&pfStack_7d8,"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x1189bc;
  fdb_kvs_open_default(pfStack_7d8,&pfStack_7d0,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1189c9;
  fdb_begin_transaction(pfStack_7d8,'\x02');
  lVar9 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1189dd;
    fdb_set(pfStack_7d0,apfStack_7b0[lVar9 + 8]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x1189f5;
  fdb_end_transaction(pfStack_7d8,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118a02;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118a0c;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118a16;
  fdb_close(pfStack_7d8);
  ppfStack_818 = (fdb_kvs_handle **)0x118a2d;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x118a3f;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  uVar15 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118a6b;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar15]->key,apfStack_7b0[uVar15]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x118a7a;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if ((int)uVar15 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118d93;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118d98;
    ppfStack_818 = (fdb_kvs_handle **)0x118a9e;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
  } while (uVar15 != 10);
  pfVar12 = (fdb_config *)auStack_7f0;
  ppfStack_818 = (fdb_kvs_handle **)0x118ad2;
  fdb_open((fdb_file_handle **)pfVar12,"dummy1",&fStack_6a8);
  ptr_fhandle = &pfStack_7d8;
  ppfStack_818 = (fdb_kvs_handle **)0x118ae5;
  fdb_open(ptr_fhandle,"dummy1",&fStack_6a8);
  ptr_handle_01 = (fdb_kvs_handle **)(auStack_7f0 + 8);
  ppfStack_818 = (fdb_kvs_handle **)0x118afe;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._0_8_,ptr_handle_01,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x118b12;
  fdb_kvs_open_default(pfStack_7d8,&pfStack_7d0,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x118b20;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  ptr_handle = &pfStack_7f8;
  ppfStack_818 = (fdb_kvs_handle **)0x118b36;
  fdb_set(pfStack_7f8,apfStack_7b0[10]);
  ppfStack_818 = (fdb_kvs_handle **)0x118b48;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118b59;
  fdb_set(pfStack_7f8,apfStack_7b0[0xb]);
  ppfStack_818 = (fdb_kvs_handle **)0x118b69;
  fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0xc]);
  ppfStack_818 = (fdb_kvs_handle **)0x118b76;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118b86;
  fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0xd]);
  ppfStack_818 = (fdb_kvs_handle **)0x118b94;
  fdb_begin_transaction(pfStack_7d8,'\x02');
  ppfStack_818 = (fdb_kvs_handle **)0x118ba4;
  fdb_set(pfStack_7d0,apfStack_7b0[0xe]);
  ppfStack_818 = (fdb_kvs_handle **)0x118bb2;
  fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118bc2;
  fdb_set(pfStack_7d0,apfStack_7b0[0xf]);
  ppfStack_818 = (fdb_kvs_handle **)0x118bd3;
  fdb_set(pfStack_7f8,apfStack_7b0[0x10]);
  ppfStack_818 = (fdb_kvs_handle **)0x118be1;
  fdb_end_transaction(pfStack_7d8,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118bf2;
  fdb_set(pfStack_7f8,apfStack_7b0[0x11]);
  uVar15 = 0;
  ppfStack_818 = (fdb_kvs_handle **)0x118bff;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\0');
  ppfStack_818 = (fdb_kvs_handle **)0x118c07;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118c10;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118c19;
  fdb_close(pfStack_7d8);
  ppfStack_818 = (fdb_kvs_handle **)0x118c30;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x118c40;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,ptr_handle,&fStack_7c8);
  while( true ) {
    ppfStack_818 = (fdb_kvs_handle **)0x118c6c;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar15 + 10]->key,apfStack_7b0[uVar15 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x118c7b;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_818 = (fdb_kvs_handle **)0x118c8d;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar15 = uVar15 + 1;
    if (uVar15 == 8) {
      ppfStack_818 = (fdb_kvs_handle **)0x118cbb;
      fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",&fStack_6a8);
      ppfStack_818 = (fdb_kvs_handle **)0x118cd0;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),
                 &fStack_7c8);
      ppfStack_818 = (fdb_kvs_handle **)0x118cdd;
      fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
      ppfStack_818 = (fdb_kvs_handle **)0x118ced;
      fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0x14]);
      ppfStack_818 = (fdb_kvs_handle **)0x118cfe;
      fdb_compact((fdb_file_handle *)auStack_7f0._16_8_,"dummy2");
      ppfStack_818 = (fdb_kvs_handle **)0x118d0b;
      fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
      ppfStack_818 = (fdb_kvs_handle **)0x118d15;
      fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
      ppfStack_818 = (fdb_kvs_handle **)0x118d1d;
      fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
      lVar9 = 0;
      do {
        ppfStack_818 = (fdb_kvs_handle **)0x118d29;
        fdb_doc_free(apfStack_7b0[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x1e);
      ppfStack_818 = (fdb_kvs_handle **)0x118d37;
      fdb_shutdown();
      ppfStack_818 = (fdb_kvs_handle **)0x118d3c;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      ppfStack_818 = (fdb_kvs_handle **)0x118d6d;
      fprintf(_stderr,pcVar13,"last wal flush header test");
      return;
    }
  }
LAB_00118d84:
  ppfStack_818 = (fdb_kvs_handle **)0x118d89;
  last_wal_flush_header_test();
LAB_00118d89:
  ppfStack_818 = (fdb_kvs_handle **)0x118d8e;
  last_wal_flush_header_test();
LAB_00118d8e:
  ppfStack_818 = (fdb_kvs_handle **)0x118d93;
  last_wal_flush_header_test();
LAB_00118d93:
  ppfStack_818 = (fdb_kvs_handle **)0x118d98;
  last_wal_flush_header_test();
LAB_00118d98:
  ppfStack_818 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_16a60 = (fdb_doc *)0x118dba;
  ppfStack_840 = &pfStack_800;
  pfStack_838 = pfVar12;
  ppfStack_830 = ptr_fhandle;
  uStack_828 = uVar15;
  ppfStack_820 = ptr_handle_01;
  ppfStack_818 = ptr_handle;
  gettimeofday(&tStack_169f8,(__timezone_ptr_t)0x0);
  pfStack_16a60 = (fdb_doc *)0x118dbf;
  memleak_start();
  pfStack_16a48 = (fdb_doc *)0x0;
  pfStack_16a60 = (fdb_doc *)0x118dd4;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_16a60 = (fdb_doc *)0x118de4;
  fdb_get_default_config();
  pfStack_16a60 = (fdb_doc *)0x118df1;
  fdb_get_default_kvs_config();
  fStack_16780.flags = 1;
  fStack_16780.purging_interval = 0;
  fStack_16780.compaction_threshold = '\0';
  fStack_16780.durability_opt = '\x02';
  pfStack_16a60 = (fdb_doc *)0x118e1e;
  fdb_open(&pfStack_16a40,"dummy1",&fStack_16780);
  pfStack_16a60 = (fdb_doc *)0x118e2e;
  fdb_kvs_open_default(pfStack_16a40,&pfStack_16a30,&fStack_169e8);
  ppfVar10 = apfStack_16588;
  __s = afStack_16988;
  pfVar11 = (fdb_doc *)0x0;
  lVar9 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar9 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar9 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_16a60 = (fdb_doc *)0x118e7c;
    lStack_16a28 = lVar9;
    memset(asStack_107c8,0x5f,sVar5);
    *(undefined1 *)((long)asStack_107c8 + sVar5) = 0;
    lVar9 = 0;
    doc_01 = ppfVar10;
    lStack_16a20 = (long)pfVar11;
    ppfStack_16a18 = ppfVar10;
    sStack_16a00 = sVar5;
    do {
      pfStack_16a60 = (fdb_doc *)0x118eb2;
      lStack_16a10 = lVar9;
      sprintf((char *)__s,"%08d");
      asStack_107c8[0] = afStack_16988[0].keylen;
      uVar15 = 0;
      lStack_16a38 = (long)pfVar11;
      ppfStack_16a08 = doc_01;
      do {
        pfStack_16a60 = (fdb_doc *)0x118eee;
        sprintf((char *)__s,"%08d",uVar15 & 0xffffffff);
        *(size_t *)((long)apfStack_16588 + sStack_16a00 + 0x5db8) = afStack_16988[0].keylen;
        uVar14 = (int)lStack_16a38 + (int)uVar15;
        pfStack_16a60 = (fdb_doc *)0x118f27;
        sprintf(acStack_16688,"meta%d",(ulong)uVar14);
        pfStack_16a60 = (fdb_doc *)0x118f3a;
        sprintf(acStack_16888,"body%d",(ulong)uVar14);
        pfStack_16a60 = (fdb_doc *)0x118f47;
        sVar5 = strlen((char *)asStack_107c8);
        pfStack_16a60 = (fdb_doc *)0x118f53;
        sVar6 = strlen(acStack_16688);
        pfStack_16a60 = (fdb_doc *)0x118f67;
        sVar7 = strlen(acStack_16888);
        lVar1 = lStack_16a38;
        pcVar13 = acStack_16888;
        pfStack_16a60 = (fdb_doc *)0x118f9a;
        fdb_doc_create(doc_01,asStack_107c8,sVar5 + 1,acStack_16688,sVar6 + 1,pcVar13,sVar7 + 1);
        uVar15 = uVar15 + 1;
        doc_01 = doc_01 + 1;
      } while (uVar15 != 10);
      lVar9 = lStack_16a10 + 1;
      doc_01 = ppfStack_16a08 + 10;
      pfVar11 = (fdb_doc *)(lVar1 + 10);
    } while (lVar9 != 100);
    lVar9 = lStack_16a28 + 1;
    ppfVar10 = ppfStack_16a18 + 1000;
    pfVar11 = (fdb_doc *)(lStack_16a20 + 1000);
  } while (lVar9 != 3);
  lVar9 = 0;
  do {
    pfStack_16a60 = (fdb_doc *)0x119010;
    fdb_set(pfStack_16a30,apfStack_16588[lVar9]);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3000);
  pfStack_16a60 = (fdb_doc *)0x11902b;
  fdb_commit(pfStack_16a40,'\x01');
  pfStack_16a60 = (fdb_doc *)0x119040;
  fdb_get_file_info(pfStack_16a40,&fStack_169d0);
  if (fStack_169d0.doc_count != 3000) {
    pfStack_16a60 = (fdb_doc *)0x119057;
    long_key_test();
  }
  lVar9 = 0;
  while( true ) {
    pfStack_16a60 = (fdb_doc *)0x119086;
    fdb_doc_create(&pfStack_16a48,apfStack_16588[lVar9]->key,apfStack_16588[lVar9]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_16a60 = (fdb_doc *)0x119095;
    fVar3 = fdb_get(pfStack_16a30,pfStack_16a48);
    doc = pfStack_16a48;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_01 = (fdb_doc **)pfStack_16a48->key;
    __s = apfStack_16588[lVar9];
    pcVar13 = (char *)__s->key;
    pfStack_16a60 = (fdb_doc *)0x1190c0;
    iVar4 = bcmp(doc_01,pcVar13,pfStack_16a48->keylen);
    pfVar11 = doc;
    if (iVar4 != 0) {
      pfStack_16a60 = (fdb_doc *)0x1191a4;
      long_key_test();
      break;
    }
    doc_01 = (fdb_doc **)doc->meta;
    pcVar13 = (char *)__s->meta;
    pfStack_16a60 = (fdb_doc *)0x1190df;
    iVar4 = bcmp(doc_01,pcVar13,doc->metalen);
    if (iVar4 != 0) goto LAB_001191b4;
    doc_01 = (fdb_doc **)doc->body;
    pcVar13 = (char *)__s->body;
    pfStack_16a60 = (fdb_doc *)0x1190fe;
    iVar4 = bcmp(doc_01,pcVar13,doc->bodylen);
    if (iVar4 != 0) goto LAB_001191a9;
    pfStack_16a60 = (fdb_doc *)0x11910e;
    fdb_doc_free(doc);
    pfStack_16a48 = (fdb_doc *)0x0;
    lVar9 = lVar9 + 1;
    if (lVar9 == 3000) {
      pfStack_16a60 = (fdb_doc *)0x119131;
      fdb_close(pfStack_16a40);
      lVar9 = 0;
      do {
        pfStack_16a60 = (fdb_doc *)0x119140;
        fdb_doc_free(apfStack_16588[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3000);
      pfStack_16a60 = (fdb_doc *)0x119151;
      fdb_shutdown();
      pfStack_16a60 = (fdb_doc *)0x119156;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_16a60 = (fdb_doc *)0x119187;
      fprintf(_stderr,pcVar13,"long key test");
      return;
    }
  }
  pfStack_16a60 = (fdb_doc *)0x1191a9;
  long_key_test();
LAB_001191a9:
  pfStack_16a60 = (fdb_doc *)0x1191b4;
  long_key_test();
LAB_001191b4:
  pfStack_16a60 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1af58 = (fdb_kvs_handle *)0x1191df;
  ppfStack_16a88 = &pfStack_16a48;
  pcStack_16a80 = pcVar13;
  lStack_16a78 = lVar9;
  pfStack_16a70 = pfVar11;
  ppfStack_16a68 = doc_01;
  pfStack_16a60 = __s;
  gettimeofday((timeval *)(auStack_1aed0 + 0x30),(__timezone_ptr_t)0x0);
  pfStack_1af58 = (fdb_kvs_handle *)0x1191e4;
  memleak_start();
  pfStack_1af58 = (fdb_kvs_handle *)0x1191f0;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1af58 = (fdb_kvs_handle *)0x119200;
  fdb_get_default_config();
  pfStack_1af58 = (fdb_kvs_handle *)0x11920a;
  fdb_get_default_kvs_config();
  fStack_1ad88.wal_threshold = 0x400;
  fStack_1ad88.compaction_mode = '\0';
  fStack_1ad88.durability_opt = '\x02';
  handle = (char *)&fStack_1aa90;
  doc_00 = apfStack_1ac90;
  pcVar13 = "kvs%d";
  uVar15 = 0;
  ptr_iterator = (fdb_iterator **)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x11924a;
    sprintf((char *)doc_00,"dummy%d",(ulong)ptr_iterator & 0xffffffff);
    ptr_handle_00 = (char *)(apfStack_1af10 + (long)ptr_iterator);
    pfStack_1af58 = (fdb_kvs_handle *)0x119265;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle_00,(char *)doc_00,&fStack_1ad88);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011969e;
    ppfVar2 = (fdb_iterator **)0x0;
    ppfStack_1af38 = ptr_iterator;
    pfStack_1af30 = (fdb_kvs_handle *)handle;
    do {
      ptr_iterator = ppfVar2;
      pfStack_1af58 = (fdb_kvs_handle *)0x11928b;
      sprintf((char *)doc_00,"kvs%d",(ulong)(uint)((int)ptr_iterator + (int)uVar15));
      pfStack_1af58 = (fdb_kvs_handle *)0x11929e;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle_00,
                           (fdb_kvs_handle **)handle,(char *)doc_00,&fStack_1af28);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1af58 = (fdb_kvs_handle *)0x11968a;
        open_multi_files_kvs_test();
        goto LAB_0011968a;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_iterator **)((long)ptr_iterator + 1);
    } while ((fdb_iterator **)((long)ptr_iterator + 1) != (fdb_iterator **)0x80);
    ptr_iterator = (fdb_iterator **)((long)ppfStack_1af38 + 1);
    uVar15 = uVar15 + 0x80;
    handle = (char *)&pfStack_1af30[1].bub_ctx.space_used;
  } while (ptr_iterator != (fdb_iterator **)0x8);
  ptr_iterator = apfStack_1ae90;
  doc_00 = apfStack_1ab90;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x119300;
      sprintf((char *)ptr_iterator,"key%08d",uVar15);
      pfStack_1af58 = (fdb_kvs_handle *)0x119313;
      sprintf((char *)doc_00,"value%08d",uVar15);
      pcVar13 = *(char **)(&fStack_1aa90.kvs_config.create_if_missing + (long)pfVar8 * 8);
      pfStack_1af58 = (fdb_kvs_handle *)0x119323;
      sVar5 = strlen((char *)ptr_iterator);
      ptr_handle_00 = (char *)(sVar5 + 1);
      pfStack_1af58 = (fdb_kvs_handle *)0x11932f;
      sVar5 = strlen((char *)doc_00);
      pfStack_1af58 = (fdb_kvs_handle *)0x119344;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar13,ptr_iterator,(size_t)ptr_handle_00,doc_00,
                         sVar5 + 1);
      handle = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968a;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x400);
  ptr_handle_00 = (char *)0x0;
  do {
    if (((ulong)ptr_handle_00 & 1) == 0) {
      pfStack_1af58 = (fdb_kvs_handle *)0x119372;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1af10[(long)ptr_handle_00],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bc;
    }
    else {
      pfStack_1af58 = (fdb_kvs_handle *)0x119385;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1af10[(long)ptr_handle_00],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c1;
    }
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  doc_00 = (fdb_iterator **)0xffffffffffffff80;
  ptr_handle_00 = (char *)apfStack_18a90;
  ptr_iterator = (fdb_iterator **)(auStack_1aed0 + 8);
  pfVar8 = (fdb_kvs_handle *)auStack_1aed0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x1193c5;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1a690[(long)doc_00],(fdb_kvs_info *)pfVar8);
    if ((fdb_custom_cmp_variable)auStack_1aed0._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1af58 = (fdb_kvs_handle *)0x11940b;
      open_multi_files_kvs_test();
    }
    pfStack_1af58 = (fdb_kvs_handle *)0x1193e5;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1a690[(long)doc_00],
                              (fdb_kvs_handle **)ptr_handle_00,10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a3;
    doc_00 = doc_00 + 0x10;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 0x400);
  } while (doc_00 < (fdb_iterator **)0x380);
  ptr_handle_00 = (char *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x11941b;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1af10[(long)ptr_handle_00],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a8;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  ptr_handle_00 = (char *)&pfStack_1af40;
  pfStack_1af40 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1af48;
  handle = "key%08d";
  doc_00 = apfStack_1ae90;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x119470;
    fdb_iterator_init(apfStack_18a90[(long)pfVar8],ptr_iterator,(void *)0x0,0,(void *)0x0,0,0);
    uVar15 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x11947f;
      fVar3 = fdb_iterator_get(pfStack_1af48,(fdb_doc **)ptr_handle_00);
      pcVar13 = (char *)pfVar8;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011968f;
      pfStack_1af58 = (fdb_kvs_handle *)0x119496;
      sprintf((char *)doc_00,"key%08d",uVar15);
      pfStack_1af58 = (fdb_kvs_handle *)0x1194a7;
      iVar4 = strcmp((char *)doc_00,(char *)pfStack_1af40->op_stats);
      if (iVar4 != 0) {
        pfStack_1af58 = (fdb_kvs_handle *)0x1194c9;
        open_multi_files_kvs_test();
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      pfStack_1af58 = (fdb_kvs_handle *)0x1194b7;
      fVar3 = fdb_iterator_next(pfStack_1af48);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1af58 = (fdb_kvs_handle *)0x1194d5;
    fdb_iterator_close(pfStack_1af48);
    pcVar13 = (char *)&(pfVar8->config).wal_threshold;
    bVar16 = pfVar8 < (fdb_kvs_handle *)0x380;
    pfVar8 = (fdb_kvs_handle *)pcVar13;
  } while (bVar16);
  pfStack_1af58 = (fdb_kvs_handle *)0x1194f6;
  fdb_doc_free((fdb_doc *)pfStack_1af40);
  ptr_handle_00 = "key%08d";
  ptr_iterator = apfStack_1ae90;
  doc_00 = (fdb_iterator **)0x0;
  do {
    uVar15 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x119519;
      sprintf((char *)ptr_iterator,"key%08d",uVar15);
      handle = *(char **)(&fStack_1aa90.kvs_config.create_if_missing + (long)doc_00 * 8);
      pfStack_1af58 = (fdb_kvs_handle *)0x119529;
      sVar5 = strlen((char *)ptr_iterator);
      pfStack_1af58 = (fdb_kvs_handle *)0x119538;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ptr_iterator,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119694;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    doc_00 = (fdb_iterator **)((long)doc_00 + 1);
  } while (doc_00 != (fdb_iterator **)0x400);
  ptr_handle_00 = "dummy_compact%d";
  ptr_iterator = apfStack_1ac90;
  pfVar8 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x119575;
    sprintf((char *)ptr_iterator,"dummy_compact%d",(ulong)pfVar8 & 0xffffffff);
    pfStack_1af58 = (fdb_kvs_handle *)0x119582;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1af10[(long)pfVar8],(char *)ptr_iterator);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ad;
    pfVar8 = (fdb_kvs_handle *)&(pfVar8->kvs_config).field_0x1;
  } while (pfVar8 != (fdb_kvs_handle *)0x8);
  ptr_handle_00 = (char *)&pfStack_1af40;
  pfStack_1af40 = (fdb_kvs_handle *)0x0;
  ptr_iterator = &pfStack_1af48;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x1195c8;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1aa90.kvs_config.create_if_missing + (long)handle * 8),
                              ptr_iterator,(void *)0x0,0,(void *)0x0,0,2);
    pfVar8 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b2;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x1195dd;
      fVar3 = fdb_iterator_get(pfStack_1af48,(fdb_doc **)ptr_handle_00);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00119699;
      pfStack_1af58 = (fdb_kvs_handle *)0x1195ef;
      fVar3 = fdb_iterator_next(pfStack_1af48);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1af58 = (fdb_kvs_handle *)0x1195fe;
    fdb_iterator_close(pfStack_1af48);
    pfVar8 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar16 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar8;
  } while (bVar16);
  pfStack_1af58 = (fdb_kvs_handle *)0x11961b;
  fdb_doc_free((fdb_doc *)pfStack_1af40);
  ptr_handle_00 = (char *)0x0;
  while( true ) {
    pfStack_1af58 = (fdb_kvs_handle *)0x119627;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1af10[(long)ptr_handle_00]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
    if ((fdb_kvs_handle **)ptr_handle_00 == (fdb_kvs_handle **)0x8) {
      pfStack_1af58 = (fdb_kvs_handle *)0x11963d;
      fdb_shutdown();
      pfStack_1af58 = (fdb_kvs_handle *)0x119642;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pfStack_1af58 = (fdb_kvs_handle *)0x119673;
      fprintf(_stderr,pcVar13,"open multi files kvs test");
      return;
    }
  }
LAB_001196b7:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196bc;
  open_multi_files_kvs_test();
LAB_001196bc:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196c1;
  open_multi_files_kvs_test();
LAB_001196c1:
  pfStack_1af58 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b2d0 = (code *)0x1196e0;
  ppfStack_1af70 = (fdb_kvs_handle **)ptr_handle_00;
  ppfStack_1af68 = doc_00;
  ppfStack_1af60 = ptr_iterator;
  pfStack_1af58 = pfVar8;
  gettimeofday(&tStack_1b280,(__timezone_ptr_t)0x0);
  pcStack_1b2d0 = (code *)0x1196e5;
  memleak_start();
  pcStack_1b2d0 = (code *)0x1196f1;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar12 = &fStack_1b270;
  pcStack_1b2d0 = (code *)0x1196fe;
  fdb_get_default_config();
  pcStack_1b2d0 = (code *)0x119708;
  fdb_get_default_kvs_config();
  pcStack_1b2d0 = (code *)0x11971c;
  fVar3 = fdb_open(&pfStack_1b2b0,"./dummy1",pfVar12);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b2d0 = (code *)0x11973f;
    fVar3 = fdb_kvs_open(pfStack_1b2b0,&pfStack_1b2a8,"db",&fStack_1b298);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f2;
    pcStack_1b2d0 = (code *)0x119762;
    fVar3 = fdb_kvs_open(pfStack_1b2b0,&pfStack_1b2a0,"db2",&fStack_1b298);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198f7;
    pfVar12 = &fStack_1b078;
    pcStack_1b2d0 = (code *)0x119785;
    sprintf((char *)pfVar12,"key%d",0);
    ptr_iterator = apfStack_1b178;
    pcStack_1b2d0 = (code *)0x1197a0;
    sprintf((char *)ptr_iterator,"body%d",0);
    pcStack_1b2d0 = (code *)0x1197a8;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pcStack_1b2d0 = (code *)0x1197b3;
    sVar5 = strlen((char *)ptr_iterator);
    doc_00 = &pfStack_1b2b8;
    pcStack_1b2d0 = (code *)0x1197d5;
    fdb_doc_create((fdb_doc **)doc_00,pfVar12,(size_t)pfVar8,(void *)0x0,0,ptr_iterator,sVar5 + 1);
    pcStack_1b2d0 = (code *)0x1197e3;
    fVar3 = fdb_set(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001198fc;
    pcStack_1b2d0 = (code *)0x1197fa;
    fVar3 = fdb_commit(pfStack_1b2b0,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119901;
    pcStack_1b2d0 = (code *)0x11981b;
    sprintf((char *)pfStack_1b2b8->tree_cursor_prev,"bOdy%d",0);
    pcStack_1b2d0 = (code *)0x11982a;
    fVar3 = fdb_set(pfStack_1b2a0,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119906;
    pcStack_1b2d0 = (code *)0x119841;
    fVar3 = fdb_commit(pfStack_1b2b0,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011990b;
    pcStack_1b2d0 = (code *)0x119858;
    fVar3 = fdb_get_metaonly(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119910;
    pcStack_1b2d0 = (code *)0x11986f;
    fVar3 = fdb_get_metaonly(pfStack_1b2a0,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119915;
    pcStack_1b2d0 = (code *)0x119886;
    fVar3 = fdb_get_byoffset(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b2d0 = (code *)0x119899;
      fdb_close(pfStack_1b2b0);
      pcStack_1b2d0 = (code *)0x1198a3;
      fdb_doc_free((fdb_doc *)pfStack_1b2b8);
      pcStack_1b2d0 = (code *)0x1198a8;
      fdb_shutdown();
      pcStack_1b2d0 = (code *)0x1198ad;
      memleak_end();
      pcVar13 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar13 = "%s FAILED\n";
      }
      pcStack_1b2d0 = (code *)0x1198de;
      fprintf(_stderr,pcVar13,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b2d0 = (code *)0x1198f2;
    get_byoffset_diff_kvs_test();
LAB_001198f2:
    pcStack_1b2d0 = (code *)0x1198f7;
    get_byoffset_diff_kvs_test();
LAB_001198f7:
    pcStack_1b2d0 = (code *)0x1198fc;
    get_byoffset_diff_kvs_test();
LAB_001198fc:
    pcStack_1b2d0 = (code *)0x119901;
    get_byoffset_diff_kvs_test();
LAB_00119901:
    pcStack_1b2d0 = (code *)0x119906;
    get_byoffset_diff_kvs_test();
LAB_00119906:
    pcStack_1b2d0 = (code *)0x11990b;
    get_byoffset_diff_kvs_test();
LAB_0011990b:
    pcStack_1b2d0 = (code *)0x119910;
    get_byoffset_diff_kvs_test();
LAB_00119910:
    pcStack_1b2d0 = (code *)0x119915;
    get_byoffset_diff_kvs_test();
LAB_00119915:
    pcStack_1b2d0 = (code *)0x11991a;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b2d0 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b2f8 = pfVar12;
  ppfStack_1b2f0 = doc_00;
  pfStack_1b2e8 = (fdb_kvs_handle *)pcVar13;
  ppfStack_1b2e0 = ptr_iterator;
  pfStack_1b2d8 = pfVar8;
  pcStack_1b2d0 = (code *)uVar15;
  gettimeofday(&tStack_1b708,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1b6f8.wal_threshold = 0x400;
  fStack_1b6f8.flags = 1;
  fStack_1b6f8.purging_interval = 0;
  fStack_1b6f8.compaction_threshold = '\0';
  fStack_1b6f8.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1b6f8.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1b760,"./dummy1",&fStack_1b6f8);
  fdb_kvs_open_default(pfStack_1b760,&pfStack_1b768,&fStack_1b720);
  fVar3 = fdb_set_log_callback(pfStack_1b768,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1b768,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119c74;
    uVar15 = 0;
    do {
      sprintf(acStack_1b500,"key%d",uVar15);
      sprintf(acStack_1b400,"body%d",uVar15);
      pfVar8 = pfStack_1b768;
      sVar5 = strlen(acStack_1b500);
      sVar6 = strlen(acStack_1b400);
      fVar3 = fdb_set_kv(pfVar8,acStack_1b500,sVar5,acStack_1b400,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119c56;
      }
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1b750[1] = 0x726162ffffffff;
    asStack_1b750[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1b738 = 0xbdbdbdbd;
    uStack_1b734 = 0xbdbdbdbd;
    uStack_1b730 = 0xbdbdbdbd;
    uStack_1b72c = 0xbdbdbdbd;
    uStack_1b728 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1b760,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c79;
    fdb_kvs_close(pfStack_1b768);
    fdb_close(pfStack_1b760);
    fStack_1b6f8.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1b6f8.encryption_key.bytes,"bar",4);
    fStack_1b6f8.encryption_key.bytes[4] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[5] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[6] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[7] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[8] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[9] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[10] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xb] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xc] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xd] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xe] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xf] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x10] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x11] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x12] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x13] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x14] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x15] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x16] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x17] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x18] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x19] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1b760,"./dummy1",&fStack_1b6f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c80;
    fVar3 = fdb_kvs_open_default(pfStack_1b760,&pfStack_1b768,&fStack_1b720);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1b768,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119c8e;
      uVar15 = 0;
      while( true ) {
        sprintf(acStack_1b500,"key%d",uVar15);
        pfVar8 = pfStack_1b768;
        sVar5 = strlen(acStack_1b500);
        fVar3 = fdb_get_kv(pfVar8,acStack_1b500,sVar5,&pvStack_1b758,asStack_1b750);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b600,"body%d",uVar15);
        ptr = pvStack_1b758;
        iVar4 = bcmp(pvStack_1b758,acStack_1b600,asStack_1b750[0]);
        if (iVar4 != 0) goto LAB_00119c56;
        fdb_free_block(ptr);
        uVar14 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1b768);
          fdb_close(pfStack_1b760);
          fdb_shutdown();
          memleak_end();
          pcVar13 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar13 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar13,"encryption rekey test");
          return;
        }
      }
LAB_00119c66:
      rekey_test();
      goto LAB_00119c6d;
    }
  }
  else {
LAB_00119c6d:
    rekey_test();
LAB_00119c74:
    rekey_test();
LAB_00119c79:
    rekey_test();
LAB_00119c80:
    rekey_test();
  }
  rekey_test();
LAB_00119c8e:
  rekey_test();
  return;
LAB_0011968a:
  pfStack_1af58 = (fdb_kvs_handle *)0x11968f;
  open_multi_files_kvs_test();
LAB_0011968f:
  pfStack_1af58 = (fdb_kvs_handle *)0x119694;
  open_multi_files_kvs_test();
LAB_00119694:
  pfStack_1af58 = (fdb_kvs_handle *)0x119699;
  open_multi_files_kvs_test();
LAB_00119699:
  pfStack_1af58 = (fdb_kvs_handle *)0x11969e;
  open_multi_files_kvs_test();
  pfVar8 = (fdb_kvs_handle *)handle;
LAB_0011969e:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196a3;
  open_multi_files_kvs_test();
LAB_001196a3:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196a8;
  open_multi_files_kvs_test();
LAB_001196a8:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196ad;
  open_multi_files_kvs_test();
LAB_001196ad:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196b2;
  open_multi_files_kvs_test();
LAB_001196b2:
  pfStack_1af58 = (fdb_kvs_handle *)0x1196b7;
  open_multi_files_kvs_test();
  goto LAB_001196b7;
LAB_00119c56:
  rekey_test();
  goto LAB_00119c66;
}

Assistant:

void auto_commit_space_used_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int ntimes = 4;
    int i;
    char fname[32];

    // remove previous func_test test files
    int r = system(SHELL_DEL" func_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= 0;
    fconfig.auto_commit = true;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    for (i = ntimes; i; --i) {
        sprintf(fname, "./func_test1");
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("auto_commit space used on close test");
}